

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O0

bool __thiscall http::Page::SendFile(Page *this,char *filename)

{
  ostream *poVar1;
  FILE *__stream;
  ulong uVar2;
  size_t sVar3;
  ostream *out;
  int count;
  uint64_t counti64;
  uchar buffer [512];
  bool rc;
  FILE *f;
  char s [512];
  char *filename_local;
  Page *this_local;
  
  buffer[0x1ff] = '\0';
  s._504_8_ = filename;
  poVar1 = get_output_stream(this);
  __stream = fopen((char *)s._504_8_,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar2 = ftell(__stream);
    fseek(__stream,0,0);
    std::operator<<(poVar1,"HTTP/1.0 200 OK\r\nContent-Type: application/java-archive\r\n");
    poVar1 = std::operator<<(poVar1,"Content-Length: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
    std::operator<<(poVar1,"\r\n\r\n");
    SendString(this,(char *)&f);
    while( true ) {
      sVar3 = fread(&counti64,1,0x200,__stream);
      if ((int)sVar3 < 1) break;
      RawSend(this,&counti64,(long)(int)sVar3);
    }
    buffer[0x1ff] = '\x01';
  }
  return (bool)(buffer[0x1ff] & 1);
}

Assistant:

bool http::Page::SendFile(const char* filename)
{
    char s[BUFFER_SIZE];
    FILE* f;
    bool rc = false;
    unsigned char buffer[512];
    uint64_t counti64;
    int count;
    std::ostream& out = get_output_stream();

    f = fopen(filename, "rb");
    if (f)
    {
#ifdef _WIN32
        _fseeki64(f, 0, SEEK_END);
        counti64 = _ftelli64(f);
        _fseeki64(f, 0, SEEK_SET);
#elif __linux__
        fseek(f, 0, SEEK_END);
        counti64 = ftell(f);
        fseek(f, 0, SEEK_SET);
#endif
        out << "HTTP/1.0 200 OK\r\nContent-Type: application/java-archive\r\n";
        out << "Content-Length: " << counti64 << "\r\n\r\n";
        SendString(s);

        do
        {
            count = (int)fread(buffer, 1, sizeof(buffer), f);
            if (count > 0)
            {
                RawSend(buffer, count);
            }
        } while (count > 0);

        rc = true;
    }

    return rc;
}